

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void deleteProcess(void)

{
  bool bVar1;
  ostream *poVar2;
  reference ppPVar3;
  reference ppMVar4;
  reference ppMVar5;
  MemBlock *local_a0;
  MemBlock *i_1;
  iterator __end2;
  iterator __begin2;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *__range2;
  value_type local_70;
  MemBlock *another;
  MemBlock *block;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> temp;
  Process *i;
  iterator __end1;
  iterator __begin1;
  list<Process_*,_std::allocator<Process_*>_> *__range1;
  Process *process;
  char *p;
  int pid;
  
  p._4_4_ = 0;
  process = (Process *)strtok((char *)0x0," ");
  if (process == (Process *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"have no enough args");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    __isoc99_sscanf(process,"%d",(long)&p + 4);
    __range1 = (list<Process_*,_std::allocator<Process_*>_> *)0x0;
    __end1 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::begin
                       (&processList_abi_cxx11_);
    i = (Process *)
        std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::end(&processList_abi_cxx11_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
      ppPVar3 = std::_List_iterator<Process_*>::operator*(&__end1);
      if ((*ppPVar3)->pid == p._4_4_) {
        __range1 = (list<Process_*,_std::allocator<Process_*>_> *)*ppPVar3;
      }
      std::_List_iterator<Process_*>::operator++(&__end1);
    }
    if (__range1 == (list<Process_*,_std::allocator<Process_*>_> *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"no process was found with that pid!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::remove
                (&processList_abi_cxx11_,(char *)&__range1);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::remove
                (&usedMemBlockList_abi_cxx11_,
                 (char *)&__range1[2].super__List_base<Process_*,_std::allocator<Process_*>_>.
                          _M_impl._M_node.super__List_node_base._M_prev);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                (&freeMemBlockList_abi_cxx11_,
                 (value_type *)
                 &__range1[2].super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl.
                  _M_node.super__List_node_base._M_prev);
      std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::sort<deleteProcess()::__0>
                ((list<MemBlock*,std::allocator<MemBlock*>> *)&freeMemBlockList_abi_cxx11_);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::list
                ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block);
      while (bVar1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::empty
                               (&freeMemBlockList_abi_cxx11_), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppMVar4 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::front
                            (&freeMemBlockList_abi_cxx11_);
        another = *ppMVar4;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::pop_front
                  (&freeMemBlockList_abi_cxx11_);
        while (bVar1 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::empty
                                 (&freeMemBlockList_abi_cxx11_), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppMVar4 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::front
                              (&freeMemBlockList_abi_cxx11_);
          local_70 = *ppMVar4;
          std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::pop_front
                    (&freeMemBlockList_abi_cxx11_);
          if (another->start + another->length != local_70->start) {
            std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_front
                      ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block,&local_70);
            break;
          }
          another->length = another->length + local_70->length;
          if (local_70 != (value_type)0x0) {
            operator_delete(local_70);
          }
        }
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                  ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block,&another);
      }
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::clear
                (&freeMemBlockList_abi_cxx11_);
      __end2 = std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::begin
                         ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block);
      i_1 = (MemBlock *)
            std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::end
                      ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&i_1), bVar1) {
        ppMVar5 = std::_List_iterator<MemBlock_*>::operator*(&__end2);
        local_a0 = *ppMVar5;
        std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::push_back
                  (&freeMemBlockList_abi_cxx11_,&local_a0);
        std::_List_iterator<MemBlock_*>::operator++(&__end2);
      }
      if (__range1 != (list<Process_*,_std::allocator<Process_*>_> *)0x0) {
        operator_delete(__range1);
      }
      std::__cxx11::list<MemBlock*,std::allocator<MemBlock*>>::sort<deleteProcess()::__1>
                ((list<MemBlock*,std::allocator<MemBlock*>> *)&freeMemBlockList_abi_cxx11_);
      std::__cxx11::list<MemBlock_*,_std::allocator<MemBlock_*>_>::~list
                ((list<MemBlock_*,_std::allocator<MemBlock_*>_> *)&block);
    }
  }
  return;
}

Assistant:

void deleteProcess() {
    // 获取参数
    int pid = 0;
    char *p = strtok(NULL, " ");
    if (!p) {
        cout << "have no enough args" << endl;
        return;
    }
    sscanf(p, "%d", &pid);
    // 在链表中寻找具有该pid的进程
    Process *process = nullptr;
    for (Process *i : processList)
        if (i->pid == pid) process = i;
    // 如果找到了
    if (process) {
        // 将process从链表中移出
        processList.remove(process);
        // 将process用过的内存块从使用过的内存链表中移出并且加入空闲内存链表
        usedMemBlockList.remove(process->memBlock);
        freeMemBlockList.push_back(process->memBlock);
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
        // 看这些链表中有没有可以合并的项
        list<MemBlock *> temp;
        while (!freeMemBlockList.empty()) {
            MemBlock *block = freeMemBlockList.front();
            freeMemBlockList.pop_front();
            while (!freeMemBlockList.empty()) {
                MemBlock *another = freeMemBlockList.front();
                freeMemBlockList.pop_front();
                if (block->start + block->length == another->start) {
                    block->length = block->length + another->length;
                    delete another;
                } else {
                    temp.push_front(another);
                    break;
                }
            }
            temp.push_back(block);
        }
        freeMemBlockList.clear();
        for (MemBlock *i : temp) freeMemBlockList.push_back(i);
        // 删除process
        delete process;
        // 将空闲内存链表按照起始地址排序
        freeMemBlockList.sort([=](MemBlock *a, MemBlock *b) -> bool {
            return a->start < b->start;
        });
    } else cout << "no process was found with that pid!" << endl;
}